

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

void __thiscall embree::SceneGraph::Transformations::~Transformations(Transformations *this)

{
  alignedFree((this->spaces).items);
  (this->spaces).size_active = 0;
  (this->spaces).size_alloced = 0;
  (this->spaces).items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
  return;
}

Assistant:

__forceinline Transformations() {}